

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  MetaCommandResult MVar1;
  PrepareResult PVar2;
  ExecuteResult EVar3;
  Table *this;
  char *pcVar4;
  ostream *poVar5;
  string local_128;
  PrepareResult local_104;
  undefined1 local_100 [4];
  PrepareResult prepareResult;
  Statement st;
  allocator<char> local_71;
  string local_70;
  Table *local_40;
  Table *table;
  string input;
  char **argv_local;
  int argc_local;
  
  input.field_2._8_8_ = argv;
  if (argc < 2) {
    std::operator<<((ostream *)&std::cout,"2nd arg not provided.\n");
    return 1;
  }
  std::__cxx11::string::string((string *)&table);
  this = (Table *)operator_new(0x10);
  Table::Table(this);
  pcVar4 = *(char **)(input.field_2._8_8_ + 8);
  local_40 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar4,&local_71);
  Table::dbOpen(this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
LAB_001029cc:
  do {
    printPrompt();
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&table);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&table);
    if (*pcVar4 == '.') {
      std::__cxx11::string::string((string *)(st.rowToInsert.email + 0x38),(string *)&table);
      MVar1 = runCommand((string *)(st.rowToInsert.email + 0x38),local_40);
      std::__cxx11::string::~string((string *)(st.rowToInsert.email + 0x38));
      if ((MVar1 != CommandSuccess) && (MVar1 == CommandUnrecognized)) {
        std::operator<<((ostream *)&std::cout,"Unrecognized command!\n");
        goto LAB_001029cc;
      }
    }
    Statement::Statement((Statement *)local_100);
    std::__cxx11::string::string((string *)&local_128,(string *)&table);
    PVar2 = Statement::prepareStatement((Statement *)local_100,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    local_104 = PVar2;
    switch(PVar2) {
    case PrepareSuccess:
    default:
      EVar3 = Statement::executeStatement((Statement *)local_100,local_40);
      if (EVar3 == ExecuteSucess) {
        std::operator<<((ostream *)&std::cout,"Executed\n");
      }
      else if ((EVar3 != ExecuteTableFull) && (EVar3 == ExecuteDuplicateKey)) {
        std::operator<<((ostream *)&std::cout,"Duplicate keys not allowed\n");
      }
      break;
    case PrepareUnrecognized:
      poVar5 = std::operator<<((ostream *)&std::cout,"Unrecognized Statement in ");
      poVar5 = std::operator<<(poVar5,(string *)&table);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      break;
    case PrepareSyntaxError:
      std::operator<<((ostream *)&std::cout,"Syntax error. Could not parse statement.\n");
      break;
    case PrepareStringTooLong:
      std::operator<<((ostream *)&std::cout,"String too long\n");
      break;
    case PrepareNegativeId:
      std::operator<<((ostream *)&std::cout,"Negative Id not allowed!\n");
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
	if (argc < 2) {
		std::cout << "2nd arg not provided.\n";
		return 1;
	}
	std::string input;
	Table *table = new Table;
	table->dbOpen(argv[1]);

	while(true) {
		printPrompt();
		getline(std::cin, input);

		if (input[0] == '.') {
			switch(runCommand(input, table)) {
				case MetaCommandResult::CommandSuccess:
				break;
				case MetaCommandResult::CommandUnrecognized:
				std::cout << "Unrecognized command!\n";
                continue;
			}
		}

		Statement st;
		auto prepareResult = st.prepareStatement(input);
		switch(prepareResult) {
			case PrepareSuccess:
				break;
			case PrepareSyntaxError:
				std::cout << "Syntax error. Could not parse statement.\n";
                continue;
			case PrepareStringTooLong:
				std::cout << "String too long\n";
                continue;
			case PrepareNegativeId:
				std::cout << "Negative Id not allowed!\n";
				continue;
			case PrepareUnrecognized:
				std::cout << "Unrecognized Statement in " << input << std::endl;
				continue;
		}

		switch(st.executeStatement(table)) {
			case ExecuteSucess:
				std::cout << "Executed\n";
				break;
			case ExecuteDuplicateKey:
				std::cout << "Duplicate keys not allowed\n";
				break;
			case ExecuteTableFull:
				break;
		}
	}

	return 0;
}